

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
               (date_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  Vector VVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  int64_t *piVar4;
  long *plVar5;
  timestamp_t *ptVar6;
  byte bVar7;
  optional_idx oVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  element_type *peVar10;
  bool bVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  VectorBuffer *pVVar14;
  idx_t iVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  SelectionVector *pSVar17;
  UnifiedVectorFormat *count_00;
  idx_t idx_in_entry;
  ulong uVar18;
  VectorType VVar19;
  Vector *vector;
  undefined1 adds_nulls_00;
  ValidityMask *pVVar20;
  char cVar21;
  ValidityMask *pVVar22;
  buffer_ptr<ValidityBuffer> *this;
  sel_t *psVar23;
  optional_idx oStack_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d8;
  ValidityMask VStack_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  unsigned_long uStack_90;
  ValidityMask *pVStack_88;
  date_t *pdStack_80;
  buffer_ptr<ValidityBuffer> *pbStack_78;
  idx_t iStack_70;
  sel_t *psStack_68;
  ulong uStack_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  idx_t local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  long *local_38;
  
  local_38 = result_data;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar23 = sel_vector->sel_vector;
      this = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      uVar18 = 0;
      pVVar20 = result_mask;
      do {
        uVar12 = uVar18;
        if (psVar23 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar23[uVar18];
        }
        vector = (Vector *)(ulong)(uint)ldata[uVar12].days;
        uStack_60 = 0x64069f;
        bVar11 = duckdb::Value::IsFinite<duckdb::date_t>((date_t)ldata[uVar12].days);
        adds_nulls_00 = SUB81(mask,0);
        cVar21 = (char)pVVar20;
        if (bVar11) goto LAB_0064073e;
        _Var16._M_head_impl =
             (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var16._M_head_impl == (unsigned_long *)0x0) {
          local_48 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          result_data = (long *)&local_48;
          uStack_60 = 0x6406c5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)result_data);
          p_Var9 = p_Stack_50;
          peVar10 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar10;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uStack_60 = 0x6406e2;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              uStack_60 = 0x6406f1;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
          }
          uStack_60 = 0x6406f9;
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(this)
          ;
          _Var16._M_head_impl =
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var16._M_head_impl;
        }
        bVar7 = (byte)uVar18 & 0x3f;
        sel_vector = (SelectionVector *)(uVar18 >> 6);
        _Var16._M_head_impl[(long)sel_vector] =
             _Var16._M_head_impl[(long)sel_vector] &
             (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        local_38[uVar18] = 0;
        uVar18 = uVar18 + 1;
      } while (count != uVar18);
    }
  }
  else if (count != 0) {
    psVar23 = sel_vector->sel_vector;
    local_40 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar18 = 0;
    pVVar20 = mask;
    pVVar22 = result_mask;
    do {
      uVar12 = uVar18;
      if (psVar23 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar23[uVar18];
      }
      sel_vector = (SelectionVector *)
                   (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar12 >> 6];
      if (((ulong)sel_vector >> (uVar12 & 0x3f) & 1) == 0) {
        _Var16._M_head_impl =
             (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var16._M_head_impl == (unsigned_long *)0x0) {
          local_48 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          result_data = (long *)&local_48;
          uStack_60 = 0x640614;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)result_data);
          p_Var9 = p_Stack_50;
          peVar10 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar10;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uStack_60 = 0x640631;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              uStack_60 = 0x640640;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
          }
          uStack_60 = 0x64064a;
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          _Var16._M_head_impl =
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var16._M_head_impl;
        }
        bVar7 = (byte)uVar18 & 0x3f;
        _Var16._M_head_impl[uVar18 >> 6] =
             _Var16._M_head_impl[uVar18 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7)
        ;
      }
      else {
        vector = (Vector *)(ulong)(uint)ldata[uVar12].days;
        uStack_60 = 0x64056e;
        bVar11 = duckdb::Value::IsFinite<duckdb::date_t>((date_t)ldata[uVar12].days);
        adds_nulls_00 = SUB81(pVVar20,0);
        cVar21 = (char)pVVar22;
        this = (buffer_ptr<ValidityBuffer> *)mask;
        if (bVar11) {
LAB_0064073e:
          uStack_60 = 0x640743;
          DatePart::TimezoneOperator::Operation<duckdb::date_t,long>((date_t)(int32_t)vector);
          VVar1 = *vector;
          VVar19 = (VectorType)result_data;
          pVStack_88 = result_mask;
          pdStack_80 = ldata;
          pbStack_78 = this;
          iStack_70 = count;
          psStack_68 = psVar23;
          uStack_60 = uVar18;
          if (VVar1 == (Vector)0x0) {
            duckdb::Vector::SetVectorType(VVar19);
            plVar5 = *(long **)((long)result_data + 0x20);
            ptVar6 = *(timestamp_t **)(vector + 0x20);
            FlatVector::VerifyFlatVector(vector);
            FlatVector::VerifyFlatVector((Vector *)result_data);
            ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
                      (ptVar6,plVar5,(idx_t)count_00,(ValidityMask *)(vector + 0x28),
                       (ValidityMask *)((long)result_data + 0x28),sel_vector,(bool)adds_nulls_00);
          }
          else {
            if (VVar1 == (Vector)0x3) {
              if (cVar21 == '\0') {
                DictionaryVector::VerifyDictionary(vector);
                pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                                    ((shared_ptr<duckdb::VectorBuffer,_true> *)(vector + 0x48));
                oStack_e0.index = *(idx_t *)(pVVar14 + 0x48);
                if (((SelectionVector *)oStack_e0.index != (SelectionVector *)0xffffffffffffffff) &&
                   (iVar15 = optional_idx::GetIndex(&oStack_e0),
                   (UnifiedVectorFormat *)(iVar15 * 2) <= count_00)) {
                  DictionaryVector::VerifyDictionary(vector);
                  pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                                      ((shared_ptr<duckdb::VectorBuffer,_true> *)(vector + 0x58));
                  if (pVVar14[0x30] == (VectorBuffer)0x0) {
                    plVar5 = *(long **)((long)result_data + 0x20);
                    ptVar6 = *(timestamp_t **)(pVVar14 + 0x50);
                    iVar15 = optional_idx::GetIndex(&oStack_e0);
                    FlatVector::VerifyFlatVector((Vector *)(pVVar14 + 0x30));
                    FlatVector::VerifyFlatVector((Vector *)result_data);
                    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
                              (ptVar6,plVar5,iVar15,(ValidityMask *)(pVVar14 + 0x58),
                               (ValidityMask *)((long)result_data + 0x28),sel_vector,
                               (bool)adds_nulls_00);
                    DictionaryVector::VerifyDictionary(vector);
                    pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                                        ((shared_ptr<duckdb::VectorBuffer,_true> *)(vector + 0x48));
                    pSVar17 = (SelectionVector *)optional_idx::GetIndex(&oStack_e0);
                    duckdb::Vector::Dictionary
                              ((Vector *)result_data,(ulong)result_data,pSVar17,
                               (ulong)(pVVar14 + 0x30));
                    return;
                  }
                }
              }
            }
            else if (VVar1 == (Vector)0x2) {
              duckdb::Vector::SetVectorType(VVar19);
              puVar3 = *(undefined8 **)((long)result_data + 0x20);
              piVar4 = *(int64_t **)(vector + 0x20);
              if ((*(byte **)(vector + 0x28) != (byte *)0x0) &&
                 ((**(byte **)(vector + 0x28) & 1) == 0)) {
                duckdb::ConstantVector::SetNull((Vector *)result_data,true);
                return;
              }
              duckdb::ConstantVector::SetNull((Vector *)result_data,false);
              bVar11 = duckdb::Value::IsFinite<duckdb::timestamp_t>((timestamp_t)*piVar4);
              if (!bVar11) {
                _Var16._M_head_impl = *(unsigned_long **)((long)result_data + 0x28);
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  uStack_90 = *(unsigned_long *)((long)result_data + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&oStack_e0,&uStack_90);
                  p_Var9 = p_Stack_d8;
                  oVar8.index = oStack_e0.index;
                  oStack_e0.index = 0;
                  p_Stack_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                            ((long)result_data + 0x38);
                  *(idx_t *)((long)result_data + 0x30) = oVar8.index;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)result_data + 0x38) =
                       p_Var9;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     p_Stack_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d8);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)((long)result_data + 0x30));
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)((long)result_data + 0x28) = _Var16._M_head_impl;
                }
                *(byte *)_Var16._M_head_impl = (byte)*_Var16._M_head_impl & 0xfe;
              }
              *puVar3 = 0;
              return;
            }
            duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&oStack_e0);
            duckdb::Vector::ToUnifiedFormat((ulong)vector,count_00);
            duckdb::Vector::SetVectorType(VVar19);
            oVar8.index = oStack_e0.index;
            plVar5 = *(long **)((long)result_data + 0x20);
            FlatVector::VerifyFlatVector((Vector *)result_data);
            ExecuteLoop<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
                      ((timestamp_t *)p_Stack_d8,plVar5,(idx_t)count_00,
                       (SelectionVector *)oVar8.index,&VStack_d0,
                       (ValidityMask *)((long)result_data + 0x28),sel_vector,(bool)adds_nulls_00);
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            if (VStack_d0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (VStack_d0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                         .
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          return;
        }
        _Var16._M_head_impl =
             (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var16._M_head_impl == (unsigned_long *)0x0) {
          local_48 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          result_data = (long *)&local_48;
          uStack_60 = 0x640594;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)result_data);
          p_Var9 = p_Stack_50;
          peVar10 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar10;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uStack_60 = 0x6405b1;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              uStack_60 = 0x6405c0;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
          }
          uStack_60 = 0x6405ca;
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          _Var16._M_head_impl =
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var16._M_head_impl;
        }
        bVar7 = (byte)uVar18 & 0x3f;
        _Var16._M_head_impl[uVar18 >> 6] =
             _Var16._M_head_impl[uVar18 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7)
        ;
        local_38[uVar18] = 0;
      }
      uVar18 = uVar18 + 1;
    } while (count != uVar18);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}